

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

void huntAndUnregister(QList<QStringView> *pathComponents,int i,UnregisterMode mode,
                      ObjectTreeNode *node)

{
  iterator __last;
  bool bVar1;
  qsizetype qVar2;
  iterator node_00;
  const_iterator in_RCX;
  int in_EDX;
  int in_ESI;
  iterator in_RDI;
  long in_FS_OFFSET;
  Iterator it;
  Iterator end;
  QStringView *in_stack_ffffffffffffff68;
  QStringView *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  int iVar4;
  const_iterator local_48 [3];
  ObjectTreeNode *local_30;
  ObjectTreeNode *local_28;
  iterator local_20;
  iterator local_18;
  QFlagsStorage<QDBusConnection::RegisterOption> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QList<QStringView>::size((QList<QStringView> *)in_RDI.i);
  if (qVar2 == in_ESI) {
    ((in_RCX.i)->field_2).obj = (QObject *)0x0;
    memset(&local_c,0,4);
    QFlags<QDBusConnection::RegisterOption>::QFlags
              ((QFlags<QDBusConnection::RegisterOption> *)0x16efac);
    ((in_RCX.i)->flags).super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
    super_QFlagsStorage<QDBusConnection::RegisterOption>.i = local_c.i;
    if (in_EDX == 1) {
      QList<QDBusConnectionPrivate::ObjectTreeNode>::clear
                ((QList<QDBusConnectionPrivate::ObjectTreeNode> *)in_stack_ffffffffffffff70);
    }
  }
  else {
    local_18.i = (ObjectTreeNode *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end
                         ((QList<QDBusConnectionPrivate::ObjectTreeNode> *)in_stack_ffffffffffffff70
                         );
    local_20.i = (ObjectTreeNode *)&DAT_aaaaaaaaaaaaaaaa;
    node_00 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin
                        ((QList<QDBusConnectionPrivate::ObjectTreeNode> *)in_stack_ffffffffffffff70)
    ;
    local_28 = local_18.i;
    QList<QStringView>::at
              ((QList<QStringView> *)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68)
    ;
    __last.i._4_4_ = in_ESI;
    __last.i._0_4_ = in_EDX;
    local_20 = std::lower_bound<QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator,QStringView>
                         (in_RDI,__last,
                          (QStringView *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_30 = local_18.i;
    bVar1 = QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator==(&local_20,local_18);
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff84);
    if (!bVar1) {
      QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator->(&local_20);
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(uVar3,in_stack_ffffffffffffff80),
                 (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QList<QStringView>::at
                ((QList<QStringView> *)in_stack_ffffffffffffff70,
                 (qsizetype)in_stack_ffffffffffffff68);
      bVar1 = operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar3 = CONCAT13(bVar1,(int3)uVar3);
    }
    if ((char)((uint)uVar3 >> 0x18) == '\0') {
      iVar4 = in_EDX;
      QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator*(&local_20);
      huntAndUnregister((QList<QStringView> *)CONCAT44(in_ESI,iVar4),(int)((ulong)in_RCX.i >> 0x20),
                        (UnregisterMode)in_RCX.i,node_00.i);
      QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator->(&local_20);
      bVar1 = QDBusConnectionPrivate::ObjectTreeNode::isActive(in_RDI.i);
      if (!bVar1) {
        QList<QDBusConnectionPrivate::ObjectTreeNode>::const_iterator::const_iterator
                  (local_48,local_20);
        QList<QDBusConnectionPrivate::ObjectTreeNode>::erase
                  ((QList<QDBusConnectionPrivate::ObjectTreeNode> *)CONCAT44(uVar3,in_EDX),in_RCX);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void huntAndUnregister(const QList<QStringView> &pathComponents, int i,
                              QDBusConnection::UnregisterMode mode,
                              QDBusConnectionPrivate::ObjectTreeNode *node)
{
    if (pathComponents.size() == i) {
        // found it
        node->obj = nullptr;
        node->flags = {};

        if (mode == QDBusConnection::UnregisterTree) {
            // clear the sub-tree as well
            node->children.clear();  // can't disconnect the objects because we really don't know if they can
                            // be found somewhere else in the path too
        }
    } else {
        // keep going
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator end = node->children.end();
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator it =
            std::lower_bound(node->children.begin(), end, pathComponents.at(i));
        if (it == end || it->name != pathComponents.at(i))
            return;              // node not found

        huntAndUnregister(pathComponents, i + 1, mode, &(*it));
        if (!it->isActive())
            node->children.erase(it);
    }
}